

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derTUINTDec2(octet *val,octet *der,size_t count,u32 tag,size_t len)

{
  octet oVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  u32 t;
  size_t l;
  u32 local_34;
  size_t local_30;
  
  sVar2 = derTLDec(&local_34,&local_30,der,count);
  sVar3 = 0xffffffffffffffff;
  if (sVar2 == 0xffffffffffffffff) {
    sVar5 = 0xffffffffffffffff;
  }
  else {
    der = der + sVar2;
    sVar5 = 0xffffffffffffffff;
    if (local_30 + sVar2 <= count) {
      sVar5 = local_30 + sVar2;
    }
  }
  if ((((local_34 == tag && sVar5 != 0xffffffffffffffff) && (local_30 != 0)) &&
      (oVar1 = *der, -1 < (char)oVar1)) &&
     (((local_30 == 1 || (oVar1 != '\0')) || ((char)der[1] < '\0')))) {
    uVar4 = 0;
    if ((local_30 != 1) && (oVar1 == '\0')) {
      uVar4 = (ulong)(der[1] >> 7);
    }
    if ((local_30 - uVar4 == len) && (sVar3 = sVar5, val != (octet *)0x0)) {
      memMove(val,der + uVar4,len);
      memRev(val,len);
    }
  }
  return sVar3;
}

Assistant:

size_t derTUINTDec2(octet* val, const octet der[], size_t count, u32 tag,
	size_t len)
{
	const octet* v;
	size_t l;
	size_t ex;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// установлен старший бит в первом (старшем) октете?
	// незначащий нулевой октет?
	if (l < 1 || (v[0] & 128) ||
		v[0] == 0 && l > 1 && !(v[1] & 128))
		return SIZE_MAX;
	// дополнительный нулевой октет?
	ex = (v[0] == 0 && l > 1 && (v[1] & 128)) ? 1 : 0;
	// длина не соответствует ожидаемой?
	if (l - ex != len)
		return SIZE_MAX;
	// возвратить значение
	if (val)
	{
		ASSERT(memIsValid(val, len));
		memMove(val, v + ex, len);
		memRev(val, len);
	}
	return count;
}